

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ActionBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ActionBlockSyntax,slang::syntax::ActionBlockSyntax_const&>
          (BumpAllocator *this,ActionBlockSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  StatementSyntax *pSVar3;
  undefined4 uVar4;
  ActionBlockSyntax *pAVar5;
  
  pAVar5 = (ActionBlockSyntax *)allocate(this,0x28,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  pSVar3 = args->statement;
  (pAVar5->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pAVar5->super_SyntaxNode).field_0x4 = uVar4;
  (pAVar5->super_SyntaxNode).parent = pSVar1;
  (pAVar5->super_SyntaxNode).previewNode = pSVar2;
  pAVar5->statement = pSVar3;
  pAVar5->elseClause = args->elseClause;
  return pAVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }